

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2Mul<unsigned_long>
          (OptimizeInstructions *this,Binary *binary,unsigned_long c)

{
  int iVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_28;
  undefined8 local_18;
  
  iVar1 = Bits::countTrailingZeroes(c);
  binary->op = ShlInt64;
  local_28.i64 = (int64_t)iVar1;
  local_18 = 3;
  if (binary->right->_id == ConstId) {
    Literal::operator=((Literal *)(binary->right + 1),(Literal *)&local_28.func);
    Literal::~Literal((Literal *)&local_28.func);
    return (Expression *)binary;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

Expression* optimizePowerOf2Mul(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShlInt32 : ShlInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }